

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

JsonParse * jsonParseCached(sqlite3_context *pCtx,sqlite3_value **argv,sqlite3_context *pErrCtx)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uchar *__src;
  JsonParse *pJVar4;
  JsonParse *pJVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  __src = sqlite3_value_text(*argv);
  iVar1 = sqlite3_value_bytes(*argv);
  iVar9 = 0;
  if (__src != (uchar *)0x0) {
    uVar6 = 0xffffffff;
    iVar7 = 0;
    uVar8 = 0;
    pJVar5 = (JsonParse *)0x0;
    while ((iVar2 = iVar7, iVar9 != 4 &&
           (pJVar4 = (JsonParse *)sqlite3_get_auxdata(pCtx,iVar9 + -0x68f72), iVar2 = iVar9,
           pJVar4 != (JsonParse *)0x0))) {
      if ((pJVar5 == (JsonParse *)0x0) &&
         ((pJVar4->nJson == iVar1 && (iVar2 = bcmp(pJVar4->zJson,__src,(long)iVar1), iVar2 == 0))))
      {
        pJVar4->nErr = '\0';
        uVar3 = pJVar4->iHold;
      }
      else {
        uVar3 = pJVar4->iHold;
        pJVar4 = pJVar5;
        if (uVar3 < uVar6) {
          iVar7 = iVar9;
          uVar6 = uVar3;
        }
      }
      if (uVar8 < uVar3) {
        uVar8 = uVar3;
      }
      iVar9 = iVar9 + 1;
      pJVar5 = pJVar4;
    }
    if (pJVar5 != (JsonParse *)0x0) {
      pJVar5->nErr = '\0';
      pJVar5->iHold = uVar8 + 1;
      return pJVar5;
    }
    pJVar5 = (JsonParse *)sqlite3_malloc64((long)iVar1 + 0x31);
    if (pJVar5 == (JsonParse *)0x0) {
      sqlite3_result_error_nomem(pCtx);
    }
    else {
      pJVar5->zJson = (char *)0x0;
      pJVar5->aUp = (u32 *)0x0;
      pJVar5->oom = '\0';
      pJVar5->nErr = '\0';
      pJVar5->iDepth = 0;
      pJVar5->nJson = 0;
      *(undefined8 *)&pJVar5->iHold = 0;
      pJVar5->nNode = 0;
      pJVar5->nAlloc = 0;
      pJVar5->aNode = (JsonNode *)0x0;
      pJVar4 = pJVar5 + 1;
      pJVar5->zJson = (char *)pJVar4;
      memcpy(pJVar4,__src,(long)(iVar1 + 1));
      iVar9 = jsonParse(pJVar5,pErrCtx,(char *)pJVar4);
      if (iVar9 == 0) {
        pJVar5->nJson = iVar1;
        pJVar5->iHold = uVar8 + 1;
        sqlite3_set_auxdata(pCtx,iVar2 + -0x68f72,pJVar5,jsonParseFree);
        pJVar5 = (JsonParse *)sqlite3_get_auxdata(pCtx,iVar2 + -0x68f72);
        return pJVar5;
      }
      sqlite3_free(pJVar5);
    }
  }
  return (JsonParse *)0x0;
}

Assistant:

static JsonParse *jsonParseCached(
  sqlite3_context *pCtx,
  sqlite3_value **argv,
  sqlite3_context *pErrCtx
){
  const char *zJson = (const char*)sqlite3_value_text(argv[0]);
  int nJson = sqlite3_value_bytes(argv[0]);
  JsonParse *p;
  JsonParse *pMatch = 0;
  int iKey;
  int iMinKey = 0;
  u32 iMinHold = 0xffffffff;
  u32 iMaxHold = 0;
  if( zJson==0 ) return 0;
  for(iKey=0; iKey<JSON_CACHE_SZ; iKey++){
    p = (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iKey);
    if( p==0 ){
      iMinKey = iKey;
      break;
    }
    if( pMatch==0
     && p->nJson==nJson
     && memcmp(p->zJson,zJson,nJson)==0
    ){
      p->nErr = 0;
      pMatch = p;
    }else if( p->iHold<iMinHold ){
      iMinHold = p->iHold;
      iMinKey = iKey;
    }
    if( p->iHold>iMaxHold ){
      iMaxHold = p->iHold;
    }
  }
  if( pMatch ){
    pMatch->nErr = 0;
    pMatch->iHold = iMaxHold+1;
    return pMatch;
  }
  p = sqlite3_malloc64( sizeof(*p) + nJson + 1 );
  if( p==0 ){
    sqlite3_result_error_nomem(pCtx);
    return 0;
  }
  memset(p, 0, sizeof(*p));
  p->zJson = (char*)&p[1];
  memcpy((char*)p->zJson, zJson, nJson+1);
  if( jsonParse(p, pErrCtx, p->zJson) ){
    sqlite3_free(p);
    return 0;
  }
  p->nJson = nJson;
  p->iHold = iMaxHold+1;
  sqlite3_set_auxdata(pCtx, JSON_CACHE_ID+iMinKey, p,
                      (void(*)(void*))jsonParseFree);
  return (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iMinKey);
}